

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O1

RealType __thiscall
OpenMD::ElementsTable::CorrectedBondRad(ElementsTable *this,int atomicnum,int hyb)

{
  pointer ppEVar1;
  double dVar2;
  
  if (this->init_ == false) {
    Init(this);
  }
  dVar2 = 1.0;
  if ((-1 < atomicnum) &&
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     atomicnum <
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3))) {
    dVar2 = ppEVar1[(uint)atomicnum]->Rcov_;
    if (hyb == 1) {
      dVar2 = dVar2 * 0.9;
    }
    else if (hyb == 2) {
      dVar2 = dVar2 * 0.95;
    }
  }
  return dVar2;
}

Assistant:

RealType ElementsTable::CorrectedBondRad(int atomicnum, int hyb) {
    RealType rad;
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return (1.0);

    rad = elements_[atomicnum]->GetCovalentRad();

    if (hyb == 2)
      rad *= 0.95;
    else if (hyb == 1)
      rad *= 0.90;

    return (rad);
  }